

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O0

opj_bool opj_decode_tile_data
                   (opj_codec_t *p_codec,OPJ_UINT32 p_tile_index,OPJ_BYTE *p_data,
                   OPJ_UINT32 p_data_size,opj_stream_t *p_stream)

{
  undefined4 in_ECX;
  long in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  long in_R8;
  opj_stream_private_t *l_cio;
  opj_codec_private_t *l_info;
  undefined4 local_4;
  
  if (((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) {
    local_4 = 0;
  }
  else if (*(int *)(in_RDI + 0x60) == 0) {
    local_4 = 0;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x18))
                        (*(undefined8 *)(in_RDI + 0x50),in_ESI,in_RDX,in_ECX,in_R8,
                         *(undefined8 *)(in_RDI + 0x58));
  }
  return local_4;
}

Assistant:

opj_bool OPJ_CALLCONV opj_decode_tile_data(
					opj_codec_t *p_codec,
					OPJ_UINT32 p_tile_index,
					OPJ_BYTE * p_data,
					OPJ_UINT32 p_data_size,
					opj_stream_t *p_stream
					)
{
	if (p_codec && p_data && p_stream) {
		opj_codec_private_t * l_info = (opj_codec_private_t *) p_codec;
		opj_stream_private_t * l_cio = (opj_stream_private_t *) p_stream;

		if (! l_info->is_decompressor) {
			return OPJ_FALSE;
		}

		return l_info->m_codec_data.m_decompression.opj_decode_tile_data(	l_info->m_codec,
																			p_tile_index,
																			p_data,
																			p_data_size,
																			l_cio,
																			l_info->m_event_mgr);
	}
	return OPJ_FALSE;
}